

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.h
# Opt level: O2

void __thiscall Steiner::~Steiner(Steiner *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_init_MST).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<Edge,_std::allocator<Edge>_>::~_Vector_base
            (&(this->_init_edges).super__Vector_base<Edge,_std::allocator<Edge>_>);
  std::_Vector_base<Edge,_std::allocator<Edge>_>::~_Vector_base
            (&(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_table_cnt).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<std::tuple<int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>::
  ~_Vector_base(&(this->_table).
                 super__Vector_base<std::tuple<int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_rank).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_par).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_ancestor).super__Vector_base<int,_std::allocator<int>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->_visit).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_lca_answer_queries).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
  ~_Vector_base(&(this->_lca_queries).
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               );
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->_lca_place);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->_edges_del).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_MST).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->_set).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<Edge,_std::allocator<Edge>_>::~_Vector_base
            (&(this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>);
  std::vector<Point,_std::allocator<Point>_>::~vector(&this->_points);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Steiner() {}